

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O0

int PHYSFS_delete(char *_fname)

{
  undefined1 *ptr;
  size_t ptr_00;
  char *_fname_00;
  size_t sVar1;
  ulong len_00;
  char *fname_00;
  undefined1 **ppuVar2;
  undefined1 *local_38;
  ulong local_30;
  size_t len;
  char *fname;
  char *pcStack_18;
  int retval;
  char *_fname_local;
  
  ppuVar2 = &local_38;
  pcStack_18 = _fname;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
    _fname_local._4_4_ = 0;
  }
  else {
    sVar1 = strlen(_fname);
    len_00 = sVar1 + 1;
    if (len_00 < 0x100) {
      ppuVar2 = (undefined1 **)((long)&local_38 - (sVar1 + 0x18 & 0xfffffffffffffff0));
      local_38 = (undefined1 *)ppuVar2;
    }
    else {
      local_38 = (undefined1 *)0x0;
    }
    ptr = local_38;
    local_30 = len_00;
    *(undefined8 *)((long)ppuVar2 + -8) = 0x109896;
    fname_00 = (char *)__PHYSFS_initSmallAlloc(ptr,len_00);
    _fname_00 = pcStack_18;
    len = (size_t)fname_00;
    if (fname_00 == (char *)0x0) {
      *(undefined8 *)((long)ppuVar2 + -8) = 0x1098ab;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      _fname_local._4_4_ = 0;
    }
    else {
      *(undefined8 *)((long)ppuVar2 + -8) = 0x1098c3;
      fname._4_4_ = doDelete(_fname_00,fname_00);
      ptr_00 = len;
      *(undefined8 *)((long)ppuVar2 + -8) = 0x1098cf;
      __PHYSFS_smallFree((void *)ptr_00);
      _fname_local._4_4_ = fname._4_4_;
    }
  }
  return _fname_local._4_4_;
}

Assistant:

int PHYSFS_delete(const char *_fname)
{
    int retval;
    char *fname;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, 0);
    len = strlen(_fname) + 1;
    fname = (char *) __PHYSFS_smallAlloc(len);
    BAIL_IF(!fname, PHYSFS_ERR_OUT_OF_MEMORY, 0);
    retval = doDelete(_fname, fname);
    __PHYSFS_smallFree(fname);
    return retval;
}